

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O3

STRING_HANDLE STRING_from_byte_array(uchar *source,size_t size)

{
  LOGGER_LOG p_Var1;
  STRING_HANDLE __ptr;
  int iVar2;
  char *pcVar3;
  size_t __size;
  
  if (size == 0 || source != (uchar *)0x0) {
    __ptr = (STRING_HANDLE)malloc(8);
    if (__ptr == (STRING_HANDLE)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        pcVar3 = "oom - unable to malloc";
        iVar2 = 0x348;
        goto LAB_00109910;
      }
    }
    else {
      __size = 0xffffffffffffffff;
      if (size + 1 != 0) {
        __size = size + 1;
      }
      if (__size != 0xffffffffffffffff) {
        pcVar3 = (char *)malloc(__size);
        __ptr->s = pcVar3;
        if (pcVar3 != (char *)0x0) {
          memcpy(pcVar3,source,size);
          pcVar3[size] = '\0';
          return __ptr;
        }
      }
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/src/strings.c"
                  ,"STRING_from_byte_array",0x353,1,"oom - unable to malloc, size=%zu",__size);
      }
      free(__ptr);
    }
  }
  else {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      pcVar3 = "invalid parameter (NULL)";
      iVar2 = 0x33e;
LAB_00109910:
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/src/strings.c"
                ,"STRING_from_byte_array",iVar2,1,pcVar3);
      return (STRING_HANDLE)0x0;
    }
  }
  return (STRING_HANDLE)0x0;
}

Assistant:

STRING_HANDLE STRING_from_byte_array(const unsigned char* source, size_t size)
{
    STRING* result;
    /*Codes_SRS_STRING_02_022: [ If source is NULL and size > 0 then STRING_from_BUFFER shall fail and return NULL. ]*/
    if ((source == NULL) && (size > 0))
    {
        LogError("invalid parameter (NULL)");
        result = NULL;
    }
    else
    {
        /*Codes_SRS_STRING_02_023: [ Otherwise, STRING_from_BUFFER shall build a string that has the same content (byte-by-byte) as source and return a non-NULL handle. ]*/
        result = (STRING*)malloc(sizeof(STRING));
        if (result == NULL)
        {
            /*Codes_SRS_STRING_02_024: [ If building the string fails, then STRING_from_BUFFER shall fail and return NULL. ]*/
            LogError("oom - unable to malloc");
            /*return as is*/
        }
        else
        {
            /*Codes_SRS_STRING_02_023: [ Otherwise, STRING_from_BUFFER shall build a string that has the same content (byte-by-byte) as source and return a non-NULL handle. ]*/
            size_t malloc_size = safe_add_size_t(size, 1);
            if (malloc_size == SIZE_MAX ||
                (result->s = (char*)malloc(malloc_size)) == NULL)
            {
                /*Codes_SRS_STRING_02_024: [ If building the string fails, then STRING_from_BUFFER shall fail and return NULL. ]*/
                LogError("oom - unable to malloc, size=%zu", malloc_size);
                free(result);
                result = NULL;
            }
            else
            {
                (void)memcpy(result->s, source, size);
                result->s[size] = '\0'; /*all is fine*/
            }
        }
    }
    return (STRING_HANDLE)result;
}